

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

_Bool split_mmio_region(uc_struct *uc,MemoryRegion *mr,uint64_t address,size_t size,_Bool do_delete)

{
  ulong address_00;
  ulong uVar1;
  undefined8 *puVar2;
  uint64_t address_01;
  uc_cb_mmio_read_t read_cb;
  void *user_data_read;
  uc_cb_mmio_write_t write_cb;
  void *user_data_write;
  undefined1 a [16];
  uc_err uVar3;
  uint64_t size_00;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  mmio_cbs backup;
  size_t m_size;
  size_t r_size;
  size_t l_size;
  uint64_t chunk_end;
  uint64_t end;
  uint64_t begin;
  _Bool do_delete_local;
  size_t size_local;
  uint64_t address_local;
  MemoryRegion *mr_local;
  uc_struct *uc_local;
  
  l_size = address + size;
  if ((mr->addr < address) || (l_size < mr->end)) {
    if (size == 0) {
      uc_local._7_1_ = false;
    }
    else {
      address_00 = mr->addr;
      uVar1 = mr->end;
      puVar2 = (undefined8 *)mr->opaque;
      read_cb = (uc_cb_mmio_read_t)*puVar2;
      user_data_read = (void *)puVar2[1];
      write_cb = (uc_cb_mmio_write_t)puVar2[2];
      user_data_write = (void *)puVar2[3];
      address_01 = mr->addr;
      a._8_8_ = in_stack_ffffffffffffff00;
      a._0_8_ = in_stack_fffffffffffffef8;
      size_00 = int128_get64((Int128)a);
      uVar3 = uc_mem_unmap(uc,address_01,size_00);
      if (uVar3 == UC_ERR_OK) {
        size_local = address;
        if (address < address_00) {
          size_local = address_00;
        }
        if (uVar1 < l_size) {
          l_size = uVar1;
        }
        if ((size_local - address_00 == 0) ||
           (uVar3 = uc_mmio_map(uc,address_00,size_local - address_00,read_cb,user_data_read,
                                write_cb,user_data_write), uVar3 == UC_ERR_OK)) {
          if (((l_size - size_local == 0) || (do_delete)) ||
             (uVar3 = uc_mmio_map(uc,size_local,l_size - size_local,read_cb,user_data_read,write_cb,
                                  user_data_write), uVar3 == UC_ERR_OK)) {
            if ((uVar1 - l_size == 0) ||
               (uVar3 = uc_mmio_map(uc,l_size,uVar1 - l_size,read_cb,user_data_read,write_cb,
                                    user_data_write), uVar3 == UC_ERR_OK)) {
              uc_local._7_1_ = true;
            }
            else {
              uc_local._7_1_ = false;
            }
          }
          else {
            uc_local._7_1_ = false;
          }
        }
        else {
          uc_local._7_1_ = false;
        }
      }
      else {
        uc_local._7_1_ = false;
      }
    }
  }
  else {
    uc_local._7_1_ = true;
  }
  return uc_local._7_1_;
}

Assistant:

static bool split_mmio_region(struct uc_struct *uc, MemoryRegion *mr,
                              uint64_t address, size_t size, bool do_delete)
{
    uint64_t begin, end, chunk_end;
    size_t l_size, r_size, m_size;
    mmio_cbs backup;

    chunk_end = address + size;

    // This branch also break recursion.
    if (address <= mr->addr && chunk_end >= mr->end) {
        return true;
    }

    if (size == 0) {
        return false;
    }

    begin = mr->addr;
    end = mr->end;

    memcpy(&backup, mr->opaque, sizeof(mmio_cbs));

    /* overlapping cases
     *               |------mr------|
     * case 1    |---size--|            // Is it possible???
     * case 2           |--size--|
     * case 3                  |---size--|
     */

    // unmap this region first, then do split it later
    if (uc_mem_unmap(uc, mr->addr, (size_t)int128_get64(mr->size)) !=
        UC_ERR_OK) {
        return false;
    }

    // adjust some things
    if (address < begin) {
        address = begin;
    }
    if (chunk_end > end) {
        chunk_end = end;
    }

    // compute sub region sizes
    l_size = (size_t)(address - begin);
    r_size = (size_t)(end - chunk_end);
    m_size = (size_t)(chunk_end - address);

    if (l_size > 0) {
        if (uc_mmio_map(uc, begin, l_size, backup.read, backup.user_data_read,
                        backup.write, backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    if (m_size > 0 && !do_delete) {
        if (uc_mmio_map(uc, address, m_size, backup.read, backup.user_data_read,
                        backup.write, backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    if (r_size > 0) {
        if (uc_mmio_map(uc, chunk_end, r_size, backup.read,
                        backup.user_data_read, backup.write,
                        backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    return true;
}